

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O3

log_map_iterator log_map_iterator_begin(log_map map)

{
  int iVar1;
  log_map_iterator iterator;
  
  if ((map != (log_map)0x0) &&
     (iterator = (log_map_iterator)malloc(0x20), iterator != (log_map_iterator)0x0)) {
    iterator->map = map;
    iterator->position = 0;
    iterator->bucket = (log_map_bucket_conflict)0x0;
    iterator->next = (map->table).data;
    iVar1 = log_map_iterator_next(iterator);
    if (iVar1 == 0) {
      return iterator;
    }
    free(iterator);
  }
  return (log_map_iterator)0x0;
}

Assistant:

log_map_iterator log_map_iterator_begin(log_map map)
{
	log_map_iterator iterator = NULL;

	if (map == NULL)
	{
		return NULL;
	}

	iterator = malloc(sizeof(struct log_map_iterator_type));

	if (iterator == NULL)
	{
		return NULL;
	}

	iterator->map = map;
	iterator->position = 0;
	iterator->bucket = NULL;
	iterator->next = &iterator->map->table.data[iterator->position];

	if (log_map_iterator_next(iterator) != 0)
	{
		free(iterator);

		return NULL;
	}

	return iterator;
}